

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O0

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>
                **objToLoad,int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  MemoryManager *pMVar5;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *this;
  XMLStringPool *pXVar6;
  undefined4 extraout_var;
  XMLCh *key;
  XercesAttGroupInfo *data;
  XMLSize_t itemIndex;
  XMLSize_t itemNumber;
  XMLSize_t local_28;
  XMLSize_t hashModulus;
  XSerializeEngine *serEng_local;
  bool toAdopt_local;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> **ppRStack_10;
  int param_1_local;
  RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> **objToLoad_local;
  
  hashModulus = (XMLSize_t)serEng;
  serEng_local._3_1_ = toAdopt;
  serEng_local._4_4_ = param_2;
  ppRStack_10 = objToLoad;
  bVar2 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar2) {
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&local_28);
    if (*ppRStack_10 ==
        (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar5 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      this = (RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher> *)
             XMemory::operator_new(0x38,pMVar5);
      bVar1 = serEng_local._3_1_;
      pMVar5 = XSerializeEngine::getMemoryManager((XSerializeEngine *)hashModulus);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::RefHashTableOf
                (this,local_28,(bool)(bVar1 & 1),pMVar5);
      *ppRStack_10 = this;
    }
    XSerializeEngine::registerObject((XSerializeEngine *)hashModulus,*ppRStack_10);
    itemIndex = 0;
    XSerializeEngine::readSize((XSerializeEngine *)hashModulus,&itemIndex);
    for (data = (XercesAttGroupInfo *)0x0; data < itemIndex;
        data = (XercesAttGroupInfo *)((long)&(data->super_XSerializable)._vptr_XSerializable + 1)) {
      xercesc_4_0::operator>>((XSerializeEngine *)hashModulus,(XercesAttGroupInfo **)&key);
      pXVar6 = XSerializeEngine::getStringPool((XSerializeEngine *)hashModulus);
      uVar3 = XercesAttGroupInfo::getNameId((XercesAttGroupInfo *)key);
      iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[10])(pXVar6,(ulong)uVar3);
      RefHashTableOf<xercesc_4_0::XercesAttGroupInfo,_xercesc_4_0::StringHasher>::put
                (*ppRStack_10,(void *)CONCAT44(extraout_var,iVar4),(XercesAttGroupInfo *)key);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<XercesAttGroupInfo>** objToLoad
                                   , int
                                   , bool                                 toAdopt
                                   , XSerializeEngine&                    serEng)
{
    if (serEng.needToLoadObject((void**)objToLoad))
    {
        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<XercesAttGroupInfo>(
                                                                hashModulus
                                                              , toAdopt
                                                              , serEng.getMemoryManager()
                                                              );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            XercesAttGroupInfo*  data;
            serEng>>data;

            XMLCh* key = (XMLCh*) serEng.getStringPool()->getValueForId(data->getNameId());
            (*objToLoad)->put((void*)key, data);
        }
    }
}